

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBottommost(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  uint local_40;
  int nLevels;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_40 = 10;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      iVar1 = Abc_NtkLatchNum(pAVar2);
      if (0 < iVar1) {
        Abc_Print(-1,"Currently only works for combinational circuits.\n");
        return 0;
      }
      pAVar2 = Abc_NtkBottommost(pAVar2,local_40);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"The command has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    if (iVar1 != 0x4e) goto LAB_0027783e;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_40 < 0) {
LAB_0027783e:
      Abc_Print(-2,"usage: bottommost [-N num] [-h]\n");
      Abc_Print(-2,"\t         replaces the current network by several of its bottommost levels\n");
      Abc_Print(-2,"\t-N num : max number of levels [default = %d]\n",(ulong)local_40);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tname   : the node name\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0027783e;
}

Assistant:

int Abc_CommandBottommost( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nLevels;
    extern Abc_Ntk_t * Abc_NtkBottommost( Abc_Ntk_t * pNtk, int nLevels );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nLevels = 10;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently only works for combinational circuits.\n" );
        return 0;
    }

    pNtkRes = Abc_NtkBottommost( pNtk, nLevels );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: bottommost [-N num] [-h]\n" );
    Abc_Print( -2, "\t         replaces the current network by several of its bottommost levels\n" );
    Abc_Print( -2, "\t-N num : max number of levels [default = %d]\n", nLevels );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tname   : the node name\n");
    return 1;
}